

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_platform_unix.c
# Opt level: O3

char * readSymLink(char *path)

{
  char *pcVar1;
  char *__buf;
  ssize_t sVar2;
  PHYSFS_uint64 __len;
  
  __len = 0x40;
  pcVar1 = (char *)(*__PHYSFS_AllocatorHooks.Realloc)((void *)0x0,0x40);
  if (pcVar1 != (char *)0x0) {
    do {
      __buf = pcVar1;
      sVar2 = readlink(path,__buf,__len);
      if (sVar2 == -1) break;
      if (sVar2 < (long)__len) {
        __buf[sVar2] = '\0';
        return __buf;
      }
      __len = __len * 2;
      pcVar1 = (char *)(*__PHYSFS_AllocatorHooks.Realloc)(__buf,__len);
    } while (pcVar1 != (char *)0x0);
    (*__PHYSFS_AllocatorHooks.Free)(__buf);
  }
  return (char *)0x0;
}

Assistant:

static char *readSymLink(const char *path)
{
    ssize_t len = 64;
    ssize_t rc = -1;
    char *retval = NULL;

    while (1)
    {
         char *ptr = (char *) allocator.Realloc(retval, (size_t) len);
         if (ptr == NULL)
             break;   /* out of memory. */
         retval = ptr;

         rc = readlink(path, retval, len);
         if (rc == -1)
             break;  /* not a symlink, i/o error, etc. */

         else if (rc < len)
         {
             retval[rc] = '\0';  /* readlink doesn't null-terminate. */
             return retval;  /* we're good to go. */
         } /* else if */

         len *= 2;  /* grow buffer, try again. */
    } /* while */

    if (retval != NULL)
        allocator.Free(retval);
    return NULL;
}